

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M68KDisassembler.c
# Opt level: O2

void d68020_bra_32(m68k_info *info)

{
  uint displacement;
  
  if ((info->type & 0x1c) != 0) {
    displacement = read_imm_32(info);
    build_relative_branch(info,0x1b,4,displacement);
    return;
  }
  d68000_invalid(info);
  return;
}

Assistant:

static void d68020_bra_32(m68k_info *info)
{
	LIMIT_CPU_TYPES(info, M68020_PLUS);
	build_relative_branch(info, M68K_INS_BRA, 4, read_imm_32(info));
}